

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  pointer pcVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40 [2];
  long local_30 [2];
  
  open(this,__file,__oflag);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->path_)._M_string_length);
  iVar2 = ::unlink((char *)local_40[0]);
  iVar3 = iVar2;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    iVar3 = extraout_EAX;
  }
  if (iVar2 != -1) {
    return iVar3;
  }
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,*(long *)__file,*(long *)(__file + 8) + *(long *)__file);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar3,"Unable to create temporary file in directory",&local_60);
}

Assistant:

void file_handle::open (temporary const, std::string const & directory) {
            this->open (unique{}, directory);
            if (::unlink (this->path ().c_str ()) == -1) {
                int const err = errno;
                raise_file_error (err, "Unable to create temporary file in directory", directory);
            }
        }